

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_clp__parse(fct_clp_t *clp,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  fctcl_t *clo;
  size_t sVar5;
  fctcl_t *pclo;
  size_t num_itemspclo;
  size_t item_ipclo;
  char *next_token;
  char *token;
  char *arg;
  int is_option;
  int argi;
  char **argv_local;
  int argc_local;
  fct_clp_t *clp_local;
  
  arg._4_4_ = 1;
  clp->error_msg[0] = '\0';
  clp->is_error = 0;
  do {
    if (argc <= arg._4_4_) {
      return;
    }
    bVar1 = false;
    token = fctstr_clone(argv[arg._4_4_]);
    pcVar3 = strtok(token,"=");
    __s = strtok((char *)0x0,"=");
    if (clp != (fct_clp_t *)0x0) {
      sVar4 = fct_nlist__size(&clp->clo_list);
      for (num_itemspclo = 0; num_itemspclo != sVar4; num_itemspclo = num_itemspclo + 1) {
        clo = (fctcl_t *)fct_nlist__at(&clp->clo_list,num_itemspclo);
        iVar2 = fctcl__is_option(clo,pcVar3);
        if (iVar2 != 0) {
          bVar1 = true;
          if (clo->action == FCTCL_STORE_VALUE) {
            if ((__s == (char *)0x0) || (sVar5 = strlen(__s), sVar5 == 0)) {
              arg._4_4_ = arg._4_4_ + 1;
              if (arg._4_4_ < argc) {
                pcVar3 = fctstr_clone(argv[arg._4_4_]);
                clo->value = pcVar3;
              }
              else {
                fct_snprintf(clp->error_msg,0x100,"missing argument for %s",pcVar3);
                clp->is_error = 1;
              }
            }
            else {
              pcVar3 = fctstr_clone(__s);
              clo->value = pcVar3;
            }
          }
          else if (clo->action == FCTCL_STORE_TRUE) {
            pcVar3 = fctstr_clone("1");
            clo->value = pcVar3;
          }
          break;
        }
      }
    }
    if (clp->is_error != 0) {
      return;
    }
    if (!bVar1) {
      fct_nlist__append(&clp->param_list,token);
      token = (char *)0x0;
    }
    arg._4_4_ = arg._4_4_ + 1;
    if (token != (char *)0x0) {
      free(token);
    }
  } while( true );
}

Assistant:

static void
fct_clp__parse(fct_clp_t *clp, int argc, char const *argv[])
{
    int argi =1;
    int is_option =0;
    char *arg =NULL;
    char *token =NULL;
    char *next_token =NULL;

    clp->error_msg[0] = '\0';
    clp->is_error =0;

    while ( argi < argc )
    {
        is_option =0;
        token =NULL;
        next_token = NULL;
        arg = fctstr_clone(argv[argi]);

#if defined(_MSC_VER) && _MSC_VER > 1300
        token = strtok_s(arg, "=", &next_token);
#else
        token = strtok(arg, "=");
        next_token = strtok(NULL, "=");
#endif

        FCT_NLIST_FOREACH_BGN(fctcl_t*, pclo, &(clp->clo_list))
        {
            /* Need to reset for each search. strtok below is destructive. */
            if ( fctcl__is_option(pclo, token) )
            {
                is_option =1;
                if ( pclo->action == FCTCL_STORE_VALUE )
                {
                    /* If this is --xxxx=value then the next strtok should succeed.
                    Otherwise, we need to chew up the next argument. */
                    if ( next_token != NULL && strlen(next_token) > 0 )
                    {
                        fctcl__set_value(pclo, next_token);
                    }
                    else
                    {
                        ++argi; /* Chew up the next value */
                        if ( argi >= argc )
                        {
                            /* error */
                            fct_snprintf(
                                clp->error_msg,
                                FCT_CLP_MAX_ERR_MSG_LEN,
                                "missing argument for %s",
                                token
                            );
                            clp->is_error =1;
                            break;
                        }
                        fctcl__set_value(pclo, argv[argi]);
                    }
                }
                else if (pclo->action == FCTCL_STORE_TRUE)
                {
                    fctcl__set_value(pclo, FCTCL_TRUE_STR);
                }
                else
                {
                    FCT_ASSERT("undefined action requested");
                }
                break;  /* No need to parse this argument further. */
            }
        }
        FCT_NLIST_FOREACH_END();
        /* If we have an error, exit. */
        if ( clp->is_error )
        {
            break;
        }
        /* If we walked through all the options, and didn't find
        anything, then we must have a parameter. Forget the fact that
        an unknown option will be treated like a parameter... */
        if ( !is_option )
        {
            fct_nlist__append(&(clp->param_list), arg);
            arg =NULL;  /* Owned by the nlist */
        }
        ++argi;
        if ( arg != NULL )
        {
            free(arg);
            arg =NULL;
        }
    }
}